

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O3

void Abc_SclUpsizePrintDiffs(SC_Man *p,SC_Lib *pLib,Abc_Ntk_t *pNtk)

{
  float fVar1;
  void *__dest;
  void *__dest_00;
  void *__dest_01;
  Vec_Ptr_t *pVVar2;
  SC_Pair *pSVar3;
  size_t __size;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  __size = (long)p->nObjs << 3;
  __dest = malloc(__size);
  __dest_00 = malloc(__size);
  __dest_01 = malloc(__size);
  memcpy(__dest,p->pTimes,__size);
  memcpy(__dest_00,p->pSlews,__size);
  memcpy(__dest_01,p->pLoads,__size);
  Abc_SclTimeNtkRecompute(p,(float *)0x0,(float *)0x0,0,0.0);
  pVVar2 = pNtk->vObjs;
  if (0 < pVVar2->nSize) {
    uVar4 = 0;
    do {
      if ((pVVar2->pArray[uVar4] != (void *)0x0) &&
         ((*(uint *)((long)pVVar2->pArray[uVar4] + 0x14) & 0xf) == 7)) {
        pSVar3 = p->pLoads;
        fVar1 = *(float *)((long)__dest_01 + uVar4 * 8);
        fVar5 = pSVar3[uVar4].rise - fVar1;
        fVar6 = -fVar5;
        if (-fVar5 <= fVar5) {
          fVar6 = fVar5;
        }
        if (0.001 < fVar6) {
          printf("%6d : load rise differs %12.6f   %f %f\n",(double)fVar5,(double)pSVar3[uVar4].rise
                 ,(double)fVar1,uVar4 & 0xffffffff);
          pSVar3 = p->pLoads;
        }
        fVar1 = *(float *)((long)__dest_01 + uVar4 * 8 + 4);
        fVar5 = pSVar3[uVar4].fall - fVar1;
        fVar6 = -fVar5;
        if (-fVar5 <= fVar5) {
          fVar6 = fVar5;
        }
        if (0.001 < fVar6) {
          printf("%6d : load fall differs %12.6f   %f %f\n",(double)fVar5,(double)pSVar3[uVar4].fall
                 ,(double)fVar1,uVar4 & 0xffffffff);
        }
        pSVar3 = p->pSlews;
        fVar1 = *(float *)((long)__dest_00 + uVar4 * 8);
        fVar5 = pSVar3[uVar4].rise - fVar1;
        fVar6 = -fVar5;
        if (-fVar5 <= fVar5) {
          fVar6 = fVar5;
        }
        if (0.001 < fVar6) {
          printf("%6d : slew rise differs %12.6f   %f %f\n",(double)fVar5,(double)pSVar3[uVar4].rise
                 ,(double)fVar1,uVar4 & 0xffffffff);
          pSVar3 = p->pSlews;
        }
        fVar1 = *(float *)((long)__dest_00 + uVar4 * 8 + 4);
        fVar5 = pSVar3[uVar4].fall - fVar1;
        fVar6 = -fVar5;
        if (-fVar5 <= fVar5) {
          fVar6 = fVar5;
        }
        if (0.001 < fVar6) {
          printf("%6d : slew fall differs %12.6f   %f %f\n",(double)fVar5,(double)pSVar3[uVar4].fall
                 ,(double)fVar1,uVar4 & 0xffffffff);
        }
        pSVar3 = p->pTimes;
        fVar1 = *(float *)((long)__dest + uVar4 * 8);
        fVar5 = pSVar3[uVar4].rise - fVar1;
        fVar6 = -fVar5;
        if (-fVar5 <= fVar5) {
          fVar6 = fVar5;
        }
        if (0.001 < fVar6) {
          printf("%6d : time rise differs %12.6f   %f %f\n",(double)fVar5,(double)pSVar3[uVar4].rise
                 ,(double)fVar1,uVar4 & 0xffffffff);
          pSVar3 = p->pTimes;
        }
        fVar1 = *(float *)((long)__dest + uVar4 * 8 + 4);
        fVar5 = pSVar3[uVar4].fall - fVar1;
        fVar6 = -fVar5;
        if (-fVar5 <= fVar5) {
          fVar6 = fVar5;
        }
        if (0.001 < fVar6) {
          printf("%6d : time fall differs %12.6f   %f %f\n",(double)fVar5,(double)pSVar3[uVar4].fall
                 ,(double)fVar1,uVar4 & 0xffffffff);
        }
      }
      uVar4 = uVar4 + 1;
      pVVar2 = pNtk->vObjs;
    } while ((long)uVar4 < (long)pVVar2->nSize);
  }
  if (__dest != (void *)0x0) {
    free(__dest);
  }
  if (__dest_00 != (void *)0x0) {
    free(__dest_00);
  }
  if (__dest_01 != (void *)0x0) {
    free(__dest_01);
    return;
  }
  return;
}

Assistant:

void Abc_SclUpsizePrintDiffs( SC_Man * p, SC_Lib * pLib, Abc_Ntk_t * pNtk )
{
    float fDiff = (float)0.001;
    int k;
    Abc_Obj_t * pObj;

    SC_Pair * pTimes = ABC_ALLOC( SC_Pair, p->nObjs );
    SC_Pair * pSlews = ABC_ALLOC( SC_Pair, p->nObjs );
    SC_Pair * pLoads = ABC_ALLOC( SC_Pair, p->nObjs );

    memcpy( pTimes, p->pTimes, sizeof(SC_Pair) * p->nObjs );
    memcpy( pSlews, p->pSlews, sizeof(SC_Pair) * p->nObjs );
    memcpy( pLoads, p->pLoads, sizeof(SC_Pair) * p->nObjs );

    Abc_SclTimeNtkRecompute( p, NULL, NULL, 0, 0 );

    Abc_NtkForEachNode( pNtk, pObj, k )
    {
        if ( Abc_AbsFloat(p->pLoads[k].rise - pLoads[k].rise) > fDiff )
            printf( "%6d : load rise differs %12.6f   %f %f\n", k, p->pLoads[k].rise-pLoads[k].rise, p->pLoads[k].rise, pLoads[k].rise );
        if ( Abc_AbsFloat(p->pLoads[k].fall - pLoads[k].fall) > fDiff )
            printf( "%6d : load fall differs %12.6f   %f %f\n", k, p->pLoads[k].fall-pLoads[k].fall, p->pLoads[k].fall, pLoads[k].fall );

        if ( Abc_AbsFloat(p->pSlews[k].rise - pSlews[k].rise) > fDiff )
            printf( "%6d : slew rise differs %12.6f   %f %f\n", k, p->pSlews[k].rise-pSlews[k].rise, p->pSlews[k].rise, pSlews[k].rise );
        if ( Abc_AbsFloat(p->pSlews[k].fall - pSlews[k].fall) > fDiff )
            printf( "%6d : slew fall differs %12.6f   %f %f\n", k, p->pSlews[k].fall-pSlews[k].fall, p->pSlews[k].fall, pSlews[k].fall );

        if ( Abc_AbsFloat(p->pTimes[k].rise - pTimes[k].rise) > fDiff )
            printf( "%6d : time rise differs %12.6f   %f %f\n", k, p->pTimes[k].rise-pTimes[k].rise, p->pTimes[k].rise, pTimes[k].rise );
        if ( Abc_AbsFloat(p->pTimes[k].fall - pTimes[k].fall) > fDiff )
            printf( "%6d : time fall differs %12.6f   %f %f\n", k, p->pTimes[k].fall-pTimes[k].fall, p->pTimes[k].fall, pTimes[k].fall );
    }

/*
if ( memcmp( pTimes, p->pTimes, sizeof(SC_Pair) * p->nObjs ) )
    printf( "Times differ!\n" );
if ( memcmp( pSlews, p->pSlews, sizeof(SC_Pair) * p->nObjs ) )
    printf( "Slews differ!\n" );
if ( memcmp( pLoads, p->pLoads, sizeof(SC_Pair) * p->nObjs ) )
    printf( "Loads differ!\n" );
*/

    ABC_FREE( pTimes );
    ABC_FREE( pSlews );
    ABC_FREE( pLoads );
}